

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

int __thiscall
chrono::ChSystemDescriptor::BuildDiagonalVector
          (ChSystemDescriptor *this,ChVectorDynamic<> *Diagonal_vect)

{
  Scalar SVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  ChKblock *pCVar8;
  ChVariables *pCVar9;
  ChConstraint *pCVar10;
  int iVar11;
  Scalar *pSVar12;
  size_t is;
  long lVar13;
  size_t iv;
  size_t ic;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_60 [24];
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_48 [24];
  
  iVar11 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar11;
  iVar11 = (*this->_vptr_ChSystemDescriptor[8])(this);
  this->n_c = iVar11;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            (&Diagonal_vect->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)iVar11 + (long)this->n_q);
  ppCVar2 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar3 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar4 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar5 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar6 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar7 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (lVar13 = 0; (long)ppCVar2 - (long)ppCVar5 >> 3 != lVar13; lVar13 = lVar13 + 1) {
    pCVar8 = (this->vstiffness).
             super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar13];
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              (local_48,&Diagonal_vect->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0)
    ;
    (*pCVar8->_vptr_ChKblock[5])(pCVar8,local_48);
  }
  for (lVar13 = 0; (long)ppCVar4 - (long)ppCVar6 >> 3 != lVar13; lVar13 = lVar13 + 1) {
    pCVar9 = (this->vvariables).
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar13];
    if (pCVar9->disabled == false) {
      Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
      Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
                (local_60,&Diagonal_vect->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (type *)0x0);
      (*pCVar9->_vptr_ChVariables[8])(this->c_a,pCVar9,local_60);
    }
  }
  for (lVar13 = 0; (long)ppCVar3 - (long)ppCVar7 >> 3 != lVar13; lVar13 = lVar13 + 1) {
    pCVar10 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar13];
    if (pCVar10->active == true) {
      SVar1 = pCVar10->cfm_i;
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           Diagonal_vect,(long)this->n_q + (long)pCVar10->offset);
      *pSVar12 = SVar1;
    }
  }
  return this->n_c + this->n_q;
}

Assistant:

int ChSystemDescriptor::BuildDiagonalVector(ChVectorDynamic<>& Diagonal_vect) {
    n_q = CountActiveVariables();
    n_c = CountActiveConstraints();
    Diagonal_vect.setZero(n_q + n_c);

    auto vs_size = vstiffness.size();
    auto vv_size = vvariables.size();
    auto vc_size = vconstraints.size();

    // Fill the diagonal values given by ChKblock objects , if any
    // (This cannot be easily parallelized because of possible write concurrency).
    for (size_t is = 0; is < vs_size; is++) {
        vstiffness[is]->DiagonalAdd(Diagonal_vect);
    }

    // Get the 'M' diagonal terms given by ChVariables objects
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->DiagonalAdd(Diagonal_vect, c_a);
        }
    }

    // Get the 'E' diagonal terms (E_i = cfm_i )
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            Diagonal_vect(vconstraints[ic]->GetOffset() + n_q) = vconstraints[ic]->Get_cfm_i();
        }
    }

    return n_q + n_c;
}